

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_erkstep.c
# Opt level: O1

int ERKStepReset(void *arkode_mem,realtype tR,N_Vector yR)

{
  int error_code;
  ARKodeMem ark_mem;
  ARKodeERKStepMem step_mem;
  ARKodeMem local_28;
  ARKodeERKStepMem local_20;
  
  error_code = erkStep_AccessStepMem(arkode_mem,"ERKStepReset",&local_28,&local_20);
  if (error_code == 0) {
    error_code = arkInit(local_28,tR,yR,1);
    if (error_code == 0) {
      error_code = 0;
    }
    else {
      arkProcessError(local_28,error_code,"ARKode::ERKStep","ERKStepReset",
                      "Unable to initialize main ARKode infrastructure");
    }
  }
  return error_code;
}

Assistant:

int ERKStepReset(void* arkode_mem, realtype tR, N_Vector yR)
{
  ARKodeMem ark_mem;
  ARKodeERKStepMem step_mem;
  int retval;

  /* access ARKodeERKStepMem structure */
  retval = erkStep_AccessStepMem(arkode_mem, "ERKStepReset",
                                 &ark_mem, &step_mem);
  if (retval != ARK_SUCCESS) return(retval);

  /* Initialize main ARKode infrastructure */
  retval = arkInit(ark_mem, tR, yR, RESET_INIT);

  if (retval != ARK_SUCCESS) {
    arkProcessError(ark_mem, retval, "ARKode::ERKStep", "ERKStepReset",
                    "Unable to initialize main ARKode infrastructure");
    return(retval);
  }

  return(ARK_SUCCESS);
}